

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1PinPage(PgHdr1 *pPage)

{
  PGroup *pPVar1;
  PGroup *pGroup;
  PCache1 *pCache;
  PgHdr1 *pPage_local;
  
  if ((pPage != (PgHdr1 *)0x0) &&
     ((pPVar1 = pPage->pCache->pGroup, pPage->pLruNext != (PgHdr1 *)0x0 ||
      (pPage == pPVar1->pLruTail)))) {
    if (pPage->pLruPrev != (PgHdr1 *)0x0) {
      pPage->pLruPrev->pLruNext = pPage->pLruNext;
    }
    if (pPage->pLruNext != (PgHdr1 *)0x0) {
      pPage->pLruNext->pLruPrev = pPage->pLruPrev;
    }
    if (pPVar1->pLruHead == pPage) {
      pPVar1->pLruHead = pPage->pLruNext;
    }
    if (pPVar1->pLruTail == pPage) {
      pPVar1->pLruTail = pPage->pLruPrev;
    }
    pPage->pLruNext = (PgHdr1 *)0x0;
    pPage->pLruPrev = (PgHdr1 *)0x0;
    pPage->pCache->nRecyclable = pPage->pCache->nRecyclable - 1;
  }
  return;
}

Assistant:

static void pcache1PinPage(PgHdr1 *pPage){
  PCache1 *pCache;
  PGroup *pGroup;

  if( pPage==0 ) return;
  pCache = pPage->pCache;
  pGroup = pCache->pGroup;
  assert( sqlite3_mutex_held(pGroup->mutex) );
  if( pPage->pLruNext || pPage==pGroup->pLruTail ){
    if( pPage->pLruPrev ){
      pPage->pLruPrev->pLruNext = pPage->pLruNext;
    }
    if( pPage->pLruNext ){
      pPage->pLruNext->pLruPrev = pPage->pLruPrev;
    }
    if( pGroup->pLruHead==pPage ){
      pGroup->pLruHead = pPage->pLruNext;
    }
    if( pGroup->pLruTail==pPage ){
      pGroup->pLruTail = pPage->pLruPrev;
    }
    pPage->pLruNext = 0;
    pPage->pLruPrev = 0;
    pPage->pCache->nRecyclable--;
  }
}